

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Singleton.h
# Opt level: O2

void __thiscall
axl::sl::ConstructSingleton<axl::err::ErrorMgr>::operator()
          (ConstructSingleton<axl::err::ErrorMgr> *this,void *p)

{
  Module *this_00;
  DestructSingleton<axl::err::ErrorMgr> *p_00;
  Ptr<axl::g::Finalizer> local_20;
  
  err::ErrorMgr::ErrorMgr((ErrorMgr *)p);
  this_00 = g::getModule();
  p_00 = (DestructSingleton<axl::err::ErrorMgr> *)mem::allocate(0x28);
  (p_00->super_RefCount).m_refCount = 0;
  (p_00->super_RefCount).m_weakRefCount = 1;
  (p_00->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__RefCount_00149fa8;
  (p_00->super_Finalizer)._vptr_Finalizer = (_func_int **)&DAT_00149fd0;
  p_00->m_p = (ErrorMgr *)p;
  (p_00->super_RefCount).m_freeFunc = mem::deallocate;
  rc::Ptr<axl::g::Finalizer>::Ptr<axl::sl::DestructSingleton<axl::err::ErrorMgr>>(&local_20,p_00);
  g::Module::addFinalizer(this_00,&local_20);
  rc::Ptr<axl::g::Finalizer>::~Ptr(&local_20);
  return;
}

Assistant:

void
	operator () (void* p) {
		new(p)T;
		g::getModule()->addFinalizer(AXL_RC_NEW_ARGS(Destruct, ((T*)p)));
	}